

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
readHyperParam(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
              string *hyperParamFilename)

{
  istream *piVar1;
  float fVar2;
  double temp;
  string token;
  string str;
  ifstream ifs;
  byte abStack_398 [488];
  istringstream stream;
  
  std::ifstream::ifstream(&ifs,(string *)hyperParamFilename,_S_in);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((abStack_398[*(long *)(_ifs + -0x18)] & 5) == 0) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifs,(string *)&str);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)&str,_S_in);
      while( true ) {
        piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream,(string *)&token,'\n');
        if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
        fVar2 = std::__cxx11::stof(&token,(size_t *)0x0);
        temp = (double)fVar2;
        std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&temp);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
      std::__cxx11::string::~string((string *)&token);
    }
    std::__cxx11::string::~string((string *)&str);
    std::ifstream::~ifstream(&ifs);
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"error");
  exit(1);
}

Assistant:

vector<double> readHyperParam(string hyperParamFilename){
    ifstream ifs(hyperParamFilename);
    vector<double> param;
    if(!ifs){
        cout<<"error";
        exit(1);
    }
    string str;
    while(getline(ifs,str)){
        string token;
        istringstream stream(str);
        while(getline(stream,token,'\n')){
            double temp=stof(token);
            param.push_back(temp);
        }
    }
    return param;
}